

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxKeys.cxx
# Opt level: O0

void __thiscall LinuxKeys::LinuxKeys(LinuxKeys *this)

{
  int iVar1;
  int *in_RDI;
  termios term;
  termios local_44;
  
  iVar1 = fileno(_stdin);
  *in_RDI = iVar1;
  memset(in_RDI + 1,0,0x3c);
  tcgetattr(*in_RDI,(termios *)(in_RDI + 1));
  memcpy(&local_44,in_RDI + 1,0x3c);
  local_44.c_lflag = local_44.c_lflag & 0xfffffff5;
  tcsetattr(*in_RDI,0,&local_44);
  setbuf(_stdin,(char *)0x0);
  return;
}

Assistant:

LinuxKeys::LinuxKeys()
:
    stdinFd_{fileno(stdin)},
    originalTermios_{}
{
        tcgetattr(stdinFd_, &originalTermios_);

        struct termios term;
        memcpy(&term, &originalTermios_, sizeof(term));

        term.c_lflag &= ~(ICANON|ECHO);
        tcsetattr(stdinFd_, TCSANOW, &term);

        setbuf(stdin, NULL);
}